

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow_cutter.h
# Opt level: O2

void __thiscall
flow_cutter::BasicCutter::
grow_assimilated_sets<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>,flow_cutter::PseudoDepthFirstSearch>
          (BasicCutter *this,
          Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>
          *graph,TemporaryData *tmp,PseudoDepthFirstSearch *search_algo)

{
  anon_class_1_0_00000001 on_new_arc;
  anon_class_1_0_00000001 on_new_node;
  anon_class_8_1_8991fb9c has_flow;
  anon_class_8_1_b4f2a08e should_follow_arc;
  anon_class_16_2_f7da023b is_backward_saturated;
  anon_class_16_2_f7da023b is_forward_saturated;
  
  has_flow.this = this;
  is_backward_saturated.this = this;
  is_backward_saturated.graph = graph;
  is_forward_saturated.this = this;
  is_forward_saturated.graph = graph;
  if (this->reachable[1].node_set.node_count_inside_ <
      this->reachable[0].node_set.node_count_inside_) {
    should_follow_arc.is_backward_saturated = &is_backward_saturated;
    AssimilatedNodeSet::
    grow<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>,flow_cutter::PseudoDepthFirstSearch,flow_cutter::BasicCutter::grow_assimilated_sets<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>,flow_cutter::PseudoDepthFirstSearch>(flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc___>>>const__flow_cutter__TemporaryData__flow_cutter__PseudoDepthFirstSearch_const_____lambda_int__10_>
              (this->assimilated + 1,graph,tmp,search_algo,&on_new_node,&should_follow_arc,
               &on_new_arc,&has_flow);
    this = (BasicCutter *)(this->assimilated + 1);
  }
  else {
    should_follow_arc.is_backward_saturated = &is_forward_saturated;
    AssimilatedNodeSet::
    grow<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>,flow_cutter::PseudoDepthFirstSearch,flow_cutter::BasicCutter::grow_assimilated_sets<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>,flow_cutter::PseudoDepthFirstSearch>(flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc___c>>>const__flow_cutter__TemporaryData__flow_cutter__PseudoDepthFirstSearch_const_____lambda_int__6_>
              (this->assimilated,graph,tmp,search_algo,&on_new_node,
               (anon_class_8_1_7e1b71c4 *)&should_follow_arc,&on_new_arc,&has_flow);
  }
  AssimilatedNodeSet::
  shrink_cut_front<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>>
            (this->assimilated,graph);
  return;
}

Assistant:

void grow_assimilated_sets(const Graph& graph, TemporaryData& tmp,
        const SearchAlgorithm& search_algo)
    {
        auto is_forward_saturated = [&, this](int xy) {
            return this->is_saturated(graph, source_side, xy);
        };

        auto is_backward_saturated = [&, this](int xy) {
            return this->is_saturated(graph, target_side, xy);
        };

        if (reachable[source_side].node_count_inside() <= reachable[target_side].node_count_inside()) {
            auto on_new_node = [&](int x) { return true; };
            auto should_follow_arc = [&](int xy) {
                return !is_forward_saturated(xy);
            };
            auto on_new_arc = [](int xy) {};
            auto has_flow = [&](int xy) { return flow(xy) != 0; };
            assimilated[source_side].grow(graph, tmp, search_algo, on_new_node,
                should_follow_arc, on_new_arc, has_flow);
            assimilated[source_side].shrink_cut_front(graph);
        } else {
            auto on_new_node = [&](int x) { return true; };
            auto should_follow_arc = [&](int xy) {
                return !is_backward_saturated(xy);
            };
            auto on_new_arc = [](int xy) {};
            auto has_flow = [&](int xy) { return flow(xy) != 0; };
            assimilated[target_side].grow(graph, tmp, search_algo, on_new_node,
                should_follow_arc, on_new_arc, has_flow);
            assimilated[target_side].shrink_cut_front(graph);
        }
    }